

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O2

void __thiscall
PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::
~ConcreteMachine(ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this)

{
  ~ConcreteMachine(this);
  operator_delete(this,0x100748);
  return;
}

Assistant:

~ConcreteMachine() {
			speaker_.queue.flush();
		}